

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  vec3f light_dir;
  TGAImage image;
  Model model;
  string local_1a0;
  string local_180;
  TGAImage local_160;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Model local_118;
  
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"obj/african_head.obj","");
  Model::Model(&local_118,&local_180,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  TGAImage::TGAImage(&local_160,600,600,3);
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0xbff0000000000000;
  light_dir.z = -1.0;
  light_dir.x = 0.0;
  light_dir.y = 0.0;
  lambert_textured_lighting(light_dir,&local_118,&local_160);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"output.tga","");
  TGAImage::write_tga_file(&local_160,&local_1a0,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_160.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Model::~Model(&local_118);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};
    TGAImage image(width, height, TGAImage::RGB);
    vec3f light_dir{0, 0, -1};
    // lambert_lighting(light_dir, model, image);
    // random_colors(model, image);
    lambert_textured_lighting(light_dir, model, image);
    image.write_tga_file("output.tga");
    return 0;
}